

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O2

size_t __thiscall camp::ArrayProperty::size(ArrayProperty *this,UserObject *object)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ForbiddenRead *__return_storage_ptr__;
  string *propertyName;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  ForbiddenRead local_60;
  
  bVar1 = Property::readable(&this->super_Property,object);
  if (bVar1) {
    iVar2 = (*(this->super_Property).super_TagHolder._vptr_TagHolder[7])(this,object);
    return CONCAT44(extraout_var,iVar2);
  }
  __return_storage_ptr__ = (ForbiddenRead *)__cxa_allocate_exception(0x48);
  propertyName = Property::name_abi_cxx11_(&this->super_Property);
  ForbiddenRead::ForbiddenRead(&local_60,propertyName);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
             ,&local_a1);
  std::__cxx11::string::string
            ((string *)&local_a0,"std::size_t camp::ArrayProperty::size(const UserObject &) const",
             &local_a2);
  Error::prepare<camp::ForbiddenRead>(__return_storage_ptr__,&local_60,&local_80,0x44,&local_a0);
  __cxa_throw(__return_storage_ptr__,&ForbiddenRead::typeinfo,Error::~Error);
}

Assistant:

std::size_t ArrayProperty::size(const UserObject& object) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    return getSize(object);
}